

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O3

void update_output(EPSG *psg)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  long lVar4;
  uint8_t uVar5;
  ushort uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  char cVar10;
  
  uVar1 = psg->base_count + psg->base_incr;
  psg->base_count = uVar1 & 0xffffff;
  uVar2 = psg->env_count + (uVar1 >> 0x18);
  if (0xffff < uVar2) {
    bVar9 = psg->env_ptr;
    uVar5 = psg->env_pause;
    do {
      if (uVar5 == '\0') {
        cVar10 = '?';
        if (psg->env_face != '\0') {
          cVar10 = '\x01';
        }
        bVar9 = bVar9 + cVar10 & 0x3f;
        psg->env_ptr = bVar9;
      }
      if ((bVar9 & 0x20) != 0) {
        if (psg->env_continue == '\0') {
          psg->env_pause = '\x01';
          uVar5 = '\x01';
LAB_0015ab75:
          bVar9 = 0;
        }
        else {
          if (psg->env_alternate != psg->env_hold) {
            psg->env_face = psg->env_face ^ 1;
          }
          if (psg->env_hold != '\0') {
            psg->env_pause = '\x01';
            uVar5 = '\x01';
          }
          bVar9 = 0x1f;
          if (psg->env_face != '\0') goto LAB_0015ab75;
        }
        psg->env_ptr = bVar9;
      }
      uVar2 = uVar2 - (psg->env_freq + (uint)(psg->env_freq == 0));
    } while (0xffff < uVar2);
  }
  psg->env_count = uVar2;
  bVar9 = (byte)(uVar1 >> 0x18);
  bVar3 = psg->noise_count + bVar9;
  psg->noise_count = bVar3;
  uVar1 = psg->noise_seed;
  if ((bVar3 & 0x40) != 0) {
    uVar7 = uVar1 >> 1;
    uVar2 = uVar1 & 1;
    uVar1 = uVar7 ^ 0x12000;
    if (uVar2 == 0) {
      uVar1 = uVar7;
    }
    psg->noise_seed = uVar1;
    uVar5 = '\x02';
    if (psg->noise_freq != '\0') {
      uVar5 = psg->noise_freq;
    }
    psg->noise_count = bVar3 - uVar5;
  }
  lVar4 = 0;
  do {
    uVar6 = psg->count[lVar4] + (ushort)bVar9;
    psg->count[lVar4] = uVar6;
    if ((uVar6 >> 0xc & 1) != 0) {
      if (psg->freq[lVar4] < 2) {
        psg->edge[lVar4] = '\x01';
      }
      else {
        psg->edge[lVar4] = psg->edge[lVar4] == '\0';
        psg->count[lVar4] = psg->count[lVar4] - psg->freq[lVar4];
      }
    }
    psg->ch_out[lVar4] = 0;
    if ((((psg->mask >> ((uint)lVar4 & 0x1f) & 1) == 0) &&
        ((psg->tmask[lVar4] != '\0' || (psg->edge[lVar4] != '\0')))) &&
       ((psg->nmask[lVar4] != '\0' || ((uVar1 & 1) != 0)))) {
      if ((psg->volume[lVar4] & 0x20) == 0) {
        uVar8 = (ulong)(psg->volume[lVar4] & 0x1f);
      }
      else {
        uVar8 = (ulong)psg->env_ptr;
      }
      psg->ch_out[lVar4] = (int16_t)(psg->voltbl[uVar8] << 5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

static void update_output(EOPLL *opll) {
  int16_t *out;
  int i;

  update_ampm(opll);
  update_short_noise(opll);
  update_slots(opll);

  out = opll->ch_out;
  // prevent DC offset when muting channels mid-playback
  memset(out, 0, 14 * sizeof(int16_t));

  /* CH1-6 */
  for (i = 0; i < 6; i++) {
    if (!(opll->mask & EOPLL_MASK_CH(i))) {
      out[i] = _MO(calc_slot_car(opll, i, calc_slot_mod(opll, i)));
    }
  }

  /* CH7 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(6))) {
      out[6] = _MO(calc_slot_car(opll, 6, calc_slot_mod(opll, 6)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_BD)) {
      out[9] = _RO(calc_slot_car(opll, 6, calc_slot_mod(opll, 6)));
    }
  }
  update_noise(opll, 14);

  /* CH8 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(7))) {
      out[7] = _MO(calc_slot_car(opll, 7, calc_slot_mod(opll, 7)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_HH)) {
      out[10] = _RO(calc_slot_hat(opll));
    }
    if (!(opll->mask & EOPLL_MASK_SD)) {
      out[11] = _RO(calc_slot_snare(opll));
    }
  }
  update_noise(opll, 2);

  /* CH9 */
  if (!opll->rhythm_mode) {
    if (!(opll->mask & EOPLL_MASK_CH(8))) {
      out[8] = _MO(calc_slot_car(opll, 8, calc_slot_mod(opll, 8)));
    }
  } else {
    if (!(opll->mask & EOPLL_MASK_TOM)) {
      out[12] = _RO(calc_slot_tom(opll));
    }
    if (!(opll->mask & EOPLL_MASK_CYM)) {
      out[13] = _RO(calc_slot_cym(opll));
    }
  }
  update_noise(opll, 2);
}